

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O3

int sipesh(void *out,size_t outlen,void *in,size_t inlen,void *salt,size_t saltlen,uint t_cost,
          uint m_cost)

{
  int iVar1;
  uint uVar2;
  yescrypt_local_t local;
  
  iVar1 = yescrypt_init_local(&local);
  uVar2 = 0xffffffff;
  if (iVar1 == 0) {
    uVar2 = yescrypt_kdf((yescrypt_shared_t *)0x0,&local,(uint8_t *)in,inlen,(uint8_t *)salt,saltlen
                         ,0x800L << ((byte)m_cost & 0x3f),8,1,t_cost,0,YESCRYPT_RW,(uint8_t *)out,
                         outlen);
    iVar1 = yescrypt_free_local(&local);
    uVar2 = -(uint)(iVar1 != 0) | uVar2;
  }
  return uVar2;
}

Assistant:

int sipesh(void *out, size_t outlen, const void *in, size_t inlen, const void *salt, size_t saltlen, unsigned int t_cost, unsigned int m_cost)
{
	yescrypt_local_t local;
	int retval;

	if (yescrypt_init_local(&local))
		return -1;
	retval = yescrypt_kdf(NULL, &local, in, inlen, salt, saltlen,
	    (uint64_t)YESCRYPT_BASE_N << m_cost, YESCRYPT_R, YESCRYPT_P,
	    t_cost, 0, YESCRYPT_FLAGS, out, outlen);
	if (yescrypt_free_local(&local))
		return -1;
	return retval;
}